

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O2

bool tinyusdz::linear_sRGB_to_linear_displayp3
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,vector<float,_std::allocator<float>_> *out_img,string *err)

{
  undefined4 uVar1;
  undefined8 uVar2;
  ostream *poVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pcVar6;
  pointer __new_size;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  size_t sVar10;
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  ostringstream ss_e;
  allocator local_209;
  string *local_208;
  undefined1 local_200 [40];
  size_t local_1d8;
  unsigned_long local_1d0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  local_1d8 = channels;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"linear_sRGB_to_linear_displayp3");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2ef);
    ::std::operator<<(poVar3," ");
    pcVar8 = "width is zero.";
  }
  else if (height == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"linear_sRGB_to_linear_displayp3");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2f3);
    ::std::operator<<(poVar3," ");
    pcVar8 = "height is zero.";
  }
  else if (channels == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"linear_sRGB_to_linear_displayp3");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2f7);
    ::std::operator<<(poVar3," ");
    pcVar8 = "channels is zero.";
  }
  else {
    if (channels - 5 < 0xfffffffffffffffe) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"linear_sRGB_to_linear_displayp3");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2fb);
      ::std::operator<<(poVar3," ");
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"channels must be 3 or 4, but got {}",(allocator *)local_200);
      fmt::format<unsigned_long>((string *)(local_200 + 8),&local_1c8,&local_1d8);
      poVar3 = ::std::operator<<((ostream *)local_1a8,(string *)(local_200 + 8));
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      goto LAB_0034b534;
    }
    if (out_img != (vector<float,_std::allocator<float>_> *)0x0) {
      __new_size = (pointer)((long)(in_img->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(in_img->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
      pcVar6 = (pointer)(height * width * channels);
      local_208 = err;
      if (__new_size == pcVar6) {
        ::std::vector<float,_std::allocator<float>_>::resize(out_img,(size_type)__new_size);
        pfVar4 = (in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5 = (out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (channels == 3) {
          pfVar5 = pfVar5 + 2;
          pfVar4 = pfVar4 + 2;
          for (sVar7 = 0; sVar7 != height; sVar7 = sVar7 + 1) {
            lVar9 = 0;
            sVar10 = width;
            while (bVar11 = sVar10 != 0, sVar10 = sVar10 - 1, bVar11) {
              uVar2 = *(undefined8 *)((long)pfVar4 + lVar9 + -8);
              fVar12 = (float)uVar2;
              fVar14 = (float)((ulong)uVar2 >> 0x20);
              auVar15._0_4_ = fVar12 * 0.8225 + fVar14 * 0.1774;
              auVar15._4_4_ = fVar14 * 0.9669 + fVar12 * 0.0332;
              auVar15._8_8_ = 0;
              auVar13 = maxps(ZEXT816(0),auVar15);
              fVar14 = fVar14 * 0.0724 + fVar12 * 0.0171 + *(float *)((long)pfVar4 + lVar9) * 0.9108
              ;
              fVar12 = 0.0;
              if (0.0 <= fVar14) {
                fVar12 = fVar14;
              }
              *(long *)((long)pfVar5 + lVar9 + -8) = auVar13._0_8_;
              *(float *)((long)pfVar5 + lVar9) = fVar12;
              lVar9 = lVar9 + 0xc;
            }
            pfVar5 = pfVar5 + width * 3;
            pfVar4 = pfVar4 + width * 3;
          }
        }
        else {
          pfVar5 = pfVar5 + 3;
          pfVar4 = pfVar4 + 3;
          for (sVar7 = 0; sVar7 != height; sVar7 = sVar7 + 1) {
            lVar9 = 0;
            sVar10 = width;
            while (bVar11 = sVar10 != 0, sVar10 = sVar10 - 1, bVar11) {
              uVar1 = *(undefined4 *)((long)pfVar4 + lVar9);
              uVar2 = *(undefined8 *)((long)pfVar4 + lVar9 + -0xc);
              fVar12 = (float)uVar2;
              fVar14 = (float)((ulong)uVar2 >> 0x20);
              auVar13._4_4_ = fVar14 * 0.9669 + fVar12 * 0.0332;
              auVar13._0_4_ = fVar12 * 0.8225 + fVar14 * 0.1774;
              auVar13._8_8_ = 0;
              auVar13 = maxps(ZEXT816(0),auVar13);
              fVar14 = fVar14 * 0.0724 + fVar12 * 0.0171 +
                       *(float *)((long)pfVar4 + lVar9 + -4) * 0.9108;
              fVar12 = 0.0;
              if (0.0 <= fVar14) {
                fVar12 = fVar14;
              }
              *(long *)((long)pfVar5 + lVar9 + -0xc) = auVar13._0_8_;
              *(float *)((long)pfVar5 + lVar9 + -4) = fVar12;
              *(undefined4 *)((long)pfVar5 + lVar9) = uVar1;
              lVar9 = lVar9 + 0x10;
            }
            pfVar5 = pfVar5 + width * 4;
            pfVar4 = pfVar4 + width * 4;
          }
        }
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"linear_sRGB_to_linear_displayp3");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x304);
      ::std::operator<<(poVar3," ");
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"Input buffer size must be {}, but got {}",&local_209);
      local_1d0 = (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2;
      local_200._0_8_ = pcVar6;
      fmt::format<unsigned_long,unsigned_long>
                ((string *)(local_200 + 8),(fmt *)&local_1c8,(string *)local_200,&local_1d0,
                 (unsigned_long *)out_img);
      poVar3 = ::std::operator<<((ostream *)local_1a8,(string *)(local_200 + 8));
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      err = local_208;
      goto LAB_0034b534;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"linear_sRGB_to_linear_displayp3");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x2ff);
    ::std::operator<<(poVar3," ");
    pcVar8 = "`out_img` is nullptr.";
  }
  poVar3 = ::std::operator<<((ostream *)local_1a8,pcVar8);
  ::std::operator<<(poVar3,"\n");
LAB_0034b534:
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return false;
}

Assistant:

bool linear_sRGB_to_linear_displayp3(const std::vector<float> &in_img, size_t width,
                         size_t height, size_t channels,
                         std::vector<float> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if ((channels != 3) && (channels != 4)) {
    PUSH_ERROR_AND_RETURN(fmt::format("channels must be 3 or 4, but got {}", channels));
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }


  if (in_img.size() != (width * height * channels)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Input buffer size must be {}, but got {}", (width * height * channels), in_img.size()));
  }

  out_img->resize(in_img.size());

  // http://endavid.com/index.php?entry=79
  // https://tech.metail.com/introduction-colour-spaces-dci-p3/

  if (channels == 3) {
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b;
        r = in_img[3 * (y * width + x) + 0];
        g = in_img[3 * (y * width + x) + 1];
        b = in_img[3 * (y * width + x) + 2];

        float out_rgb[3];
        out_rgb[0] = 0.8225f * r + 0.1774f * g;
        out_rgb[1] = 0.0332f * r + 0.9669f * g;
        out_rgb[2] = 0.0171f * r + 0.0724f * g + 0.9108f * b;

        // clamp for just in case.
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[3 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[3 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[3 * (y * width + x) + 2] = out_rgb[2];
      }
    }

  } else { // rgba
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b, a;
        r = in_img[4 * (y * width + x) + 0];
        g = in_img[4 * (y * width + x) + 1];
        b = in_img[4 * (y * width + x) + 2];
        a = in_img[4 * (y * width + x) + 3];

        float out_rgb[3];
        out_rgb[0] = 0.8225f * r + 0.1774f * g;
        out_rgb[1] = 0.0332f * r + 0.9669f * g;
        out_rgb[2] = 0.0171f * r + 0.0724f * g + 0.9108f * b;

        // clamp for just in case.
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[4 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[4 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[4 * (y * width + x) + 2] = out_rgb[2];
        (*out_img)[4 * (y * width + x) + 3] = a;
      }
    }
  }

  return true;
}